

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euarel.cc
# Opt level: O2

string * OB::Euarel::url_decode(string *__return_storage_ptr__,string *str,bool form)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  string local_60;
  ulong local_40;
  string *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar3 = 0;
  do {
    if (str->_M_string_length <= uVar3) {
      return local_38;
    }
    pcVar1 = (str->_M_dataplus)._M_p;
    if (pcVar1[uVar3] == '+' && form) {
      std::__cxx11::string::append((char *)local_38);
    }
    else {
      if ((pcVar1[uVar3] == '%') && (local_40 = uVar3 + 2, local_40 < str->_M_string_length)) {
        iVar2 = isxdigit((uint)(byte)pcVar1[uVar3 + 1]);
        if (iVar2 != 0) {
          iVar2 = isxdigit((uint)(byte)pcVar1[local_40]);
          if (iVar2 != 0) {
            std::__cxx11::string::substr((ulong)&local_60,(ulong)str);
            hex_decode(&local_60);
            std::__cxx11::string::push_back((char)local_38);
            std::__cxx11::string::~string((string *)&local_60);
            uVar3 = local_40;
            goto LAB_0010801d;
          }
        }
      }
      std::__cxx11::string::push_back((char)local_38);
    }
LAB_0010801d:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string url_decode(std::string const& str, bool form)
{
  std::string res;
  res.reserve(str.size());

  for (std::size_t i = 0; i < str.size(); ++i)
  {
    if (str[i] == '+' && form)
    {
      res += " ";
    }
    else if (str[i] == '%' && i + 2 < str.size() &&
      std::isxdigit(static_cast<unsigned char>(str[i + 1])) &&
      std::isxdigit(static_cast<unsigned char>(str[i + 2])))
    {
      res += hex_decode(str.substr(i + 1, 2));
      i += 2;
    }
    else
    {
      res += str[i];
    }
  }

  return res;
}